

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_align.cpp
# Opt level: O3

Read<int> __thiscall
Omega_h::align_ev2v_deg<2,long>(Omega_h *this,Read<int> *ev2v,Read<signed_char> *codes)

{
  int *piVar1;
  Alloc *pAVar2;
  Alloc *pAVar3;
  uint uVar4;
  ulong uVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar6;
  size_t sVar7;
  int n;
  Read<int> RVar8;
  Write<int> ev2v_w;
  type f;
  Write<long> local_88;
  Write<long> local_70;
  type local_60;
  
  pAVar2 = (ev2v->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    uVar5 = pAVar2->size;
  }
  else {
    uVar5 = (ulong)pAVar2 >> 3;
  }
  pAVar3 = (codes->write_).shared_alloc_.alloc;
  uVar4 = (uint)(uVar5 >> 3);
  if (((ulong)pAVar3 & 1) == 0) {
    n = (int)pAVar3->size;
    if (n * 2 == uVar4) {
LAB_001e258a:
      if (((ulong)pAVar2 & 1) == 0) {
        sVar7 = pAVar2->size;
      }
      else {
        sVar7 = (ulong)pAVar2 >> 3;
      }
      local_60.codes.write_.shared_alloc_.alloc = (Alloc *)&local_60.ev2v;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
      Write<long>::Write(&local_88,(LO)(sVar7 >> 3),(string *)&local_60);
      if (local_60.codes.write_.shared_alloc_.alloc != (Alloc *)&local_60.ev2v) {
        operator_delete(local_60.codes.write_.shared_alloc_.alloc,
                        (ulong)((long)&(local_60.ev2v.write_.shared_alloc_.alloc)->size + 1));
      }
      local_60.codes.write_.shared_alloc_.alloc = (codes->write_).shared_alloc_.alloc;
      if (((ulong)local_60.codes.write_.shared_alloc_.alloc & 7) == 0 &&
          local_60.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_60.codes.write_.shared_alloc_.alloc =
               (Alloc *)((local_60.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_60.codes.write_.shared_alloc_.alloc)->use_count =
               (local_60.codes.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_60.codes.write_.shared_alloc_.direct_ptr = (codes->write_).shared_alloc_.direct_ptr;
      local_60.ev2v.write_.shared_alloc_.alloc = (ev2v->write_).shared_alloc_.alloc;
      if (((ulong)local_60.ev2v.write_.shared_alloc_.alloc & 7) == 0 &&
          local_60.ev2v.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_60.ev2v.write_.shared_alloc_.alloc =
               (Alloc *)((local_60.ev2v.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_60.ev2v.write_.shared_alloc_.alloc)->use_count =
               (local_60.ev2v.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_60.ev2v.write_.shared_alloc_.direct_ptr = (ev2v->write_).shared_alloc_.direct_ptr;
      local_60.ev2v_w.shared_alloc_.alloc = local_88.shared_alloc_.alloc;
      if (((ulong)local_88.shared_alloc_.alloc & 7) == 0 &&
          local_88.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_60.ev2v_w.shared_alloc_.alloc =
               (Alloc *)((local_88.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_88.shared_alloc_.alloc)->use_count = (local_88.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_60.ev2v_w.shared_alloc_.direct_ptr = local_88.shared_alloc_.direct_ptr;
      parallel_for<Omega_h::align_ev2v_deg<2,long>(Omega_h::Read<long>,Omega_h::Read<signed_char>)::_lambda(int)_1_>
                (n,&local_60,"align_ev2v");
      local_70.shared_alloc_.alloc = local_88.shared_alloc_.alloc;
      local_70.shared_alloc_.direct_ptr = local_88.shared_alloc_.direct_ptr;
      if ((((ulong)local_88.shared_alloc_.alloc & 7) == 0 &&
           local_88.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
        (local_88.shared_alloc_.alloc)->use_count = (local_88.shared_alloc_.alloc)->use_count + -1;
        local_70.shared_alloc_.alloc = (Alloc *)((local_88.shared_alloc_.alloc)->size * 8 + 1);
      }
      local_88.shared_alloc_.alloc = (Alloc *)0x0;
      local_88.shared_alloc_.direct_ptr = (void *)0x0;
      Read<long>::Read((Read<signed_char> *)this,&local_70);
      pAVar2 = local_70.shared_alloc_.alloc;
      if (((ulong)local_70.shared_alloc_.alloc & 7) == 0 &&
          local_70.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_70.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_70.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
        }
      }
      align_ev2v_deg<2,long>(Omega_h::Read<long>,Omega_h::Read<signed_char>)::{lambda(int)#1}::~Read
                ((_lambda_int__1_ *)&local_60);
      pAVar2 = local_88.shared_alloc_.alloc;
      pvVar6 = extraout_RDX;
      if (((ulong)local_88.shared_alloc_.alloc & 7) == 0 &&
          local_88.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_88.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_88.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
          pvVar6 = extraout_RDX_00;
        }
      }
      RVar8.write_.shared_alloc_.direct_ptr = pvVar6;
      RVar8.write_.shared_alloc_.alloc = (Alloc *)this;
      return (Read<int>)RVar8.write_.shared_alloc_;
    }
  }
  else if (((uint)((ulong)pAVar3 >> 2) & 0xfffffffe) == uVar4) {
    n = (int)((ulong)pAVar3 >> 3);
    goto LAB_001e258a;
  }
  fail("assertion %s failed at %s +%d\n","ev2v.size() == codes.size() * deg",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_align.cpp"
       ,9);
}

Assistant:

Read<T> align_ev2v_deg(Read<T> ev2v, Read<I8> codes) {
  OMEGA_H_CHECK(ev2v.size() == codes.size() * deg);
  auto ne = codes.size();
  Write<T> ev2v_w(ev2v.size());
  auto f = OMEGA_H_LAMBDA(LO e) {
    align_adj<deg>(codes[e], ev2v, e * deg, ev2v_w, e * deg);
  };
  parallel_for(ne, f, "align_ev2v");
  return ev2v_w;
}